

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__empty_ring_buffer(stbir__info *stbir_info,int first_necessary_scanline)

{
  int iVar1;
  int channels_00;
  int alpha_channel_00;
  stbir_datatype sVar2;
  stbir_colorspace sVar3;
  int num_pixels;
  int iVar4;
  int iVar5;
  void *pvVar6;
  float *ring_buffer_00;
  float *encode_buffer;
  float *ring_buffer_entry;
  int output_row_start;
  int ring_buffer_length;
  float *ring_buffer;
  int decode;
  void *output_data;
  int output_w;
  int colorspace;
  int type;
  int alpha_channel;
  int channels;
  int output_stride_bytes;
  int first_necessary_scanline_local;
  stbir__info *stbir_info_local;
  
  iVar1 = stbir_info->output_stride_bytes;
  channels_00 = stbir_info->channels;
  alpha_channel_00 = stbir_info->alpha_channel;
  sVar2 = stbir_info->type;
  sVar3 = stbir_info->colorspace;
  num_pixels = stbir_info->output_w;
  pvVar6 = stbir_info->output_data;
  ring_buffer_00 = stbir_info->ring_buffer;
  iVar4 = stbir_info->ring_buffer_length_bytes;
  if (-1 < stbir_info->ring_buffer_begin_index) {
    while (stbir_info->ring_buffer_first_scanline < first_necessary_scanline) {
      if ((-1 < stbir_info->ring_buffer_first_scanline) &&
         (stbir_info->ring_buffer_first_scanline < stbir_info->output_h)) {
        iVar5 = stbir_info->ring_buffer_first_scanline;
        encode_buffer =
             stbir__get_ring_buffer_entry
                       (ring_buffer_00,stbir_info->ring_buffer_begin_index,
                        (int)((ulong)(long)iVar4 >> 2));
        stbir__encode_scanline
                  (stbir_info,num_pixels,(void *)((long)pvVar6 + (long)(iVar5 * iVar1)),
                   encode_buffer,channels_00,alpha_channel_00,sVar2 * 2 + sVar3);
      }
      if (stbir_info->ring_buffer_first_scanline == stbir_info->ring_buffer_last_scanline) {
        stbir_info->ring_buffer_begin_index = -1;
        stbir_info->ring_buffer_first_scanline = 0;
        stbir_info->ring_buffer_last_scanline = 0;
        return;
      }
      stbir_info->ring_buffer_first_scanline = stbir_info->ring_buffer_first_scanline + 1;
      stbir_info->ring_buffer_begin_index =
           (stbir_info->ring_buffer_begin_index + 1) % stbir_info->ring_buffer_num_entries;
    }
  }
  return;
}

Assistant:

static void stbir__empty_ring_buffer(stbir__info* stbir_info, int first_necessary_scanline)
{
    int output_stride_bytes = stbir_info->output_stride_bytes;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int output_w = stbir_info->output_w;
    void* output_data = stbir_info->output_data;
    int decode = STBIR__DECODE(type, colorspace);

    float* ring_buffer = stbir_info->ring_buffer;
    int ring_buffer_length = stbir_info->ring_buffer_length_bytes/sizeof(float);

    if (stbir_info->ring_buffer_begin_index >= 0)
    {
        // Get rid of whatever we don't need anymore.
        while (first_necessary_scanline > stbir_info->ring_buffer_first_scanline)
        {
            if (stbir_info->ring_buffer_first_scanline >= 0 && stbir_info->ring_buffer_first_scanline < stbir_info->output_h)
            {
                int output_row_start = stbir_info->ring_buffer_first_scanline * output_stride_bytes;
                float* ring_buffer_entry = stbir__get_ring_buffer_entry(ring_buffer, stbir_info->ring_buffer_begin_index, ring_buffer_length);
                stbir__encode_scanline(stbir_info, output_w, (char *) output_data + output_row_start, ring_buffer_entry, channels, alpha_channel, decode);
                STBIR_PROGRESS_REPORT((float)stbir_info->ring_buffer_first_scanline / stbir_info->output_h);
            }

            if (stbir_info->ring_buffer_first_scanline == stbir_info->ring_buffer_last_scanline)
            {
                // We just popped the last scanline off the ring buffer.
                // Reset it to the empty state.
                stbir_info->ring_buffer_begin_index = -1;
                stbir_info->ring_buffer_first_scanline = 0;
                stbir_info->ring_buffer_last_scanline = 0;
                break;
            }
            else
            {
                stbir_info->ring_buffer_first_scanline++;
                stbir_info->ring_buffer_begin_index = (stbir_info->ring_buffer_begin_index + 1) % stbir_info->ring_buffer_num_entries;
            }
        }
    }
}